

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,Time val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  string *val_00;
  reference pvVar4;
  ulong uVar5;
  _Alloc_hider _Var6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  char *pcVar7;
  initializer_list<double> __l;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  vector<double,_std::allocator<double>_> vec;
  json json;
  NamedPoint local_a8;
  double local_80;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  data local_48;
  data local_30;
  
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    fmt.size_ = 3;
    fmt.data_ = (char *)0x2;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_78;
    local_78._M_dataplus._M_p = (pointer)val.internalTimeCode;
    ::fmt::v11::vformat_abi_cxx11_(&local_a8.name,(v11 *)0x44c60e,fmt,args);
    local_58._M_len = local_a8.name._M_string_length;
    local_58._M_str = local_a8.name._M_dataplus._M_p;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,&local_58);
    local_78.field_2._M_allocated_capacity = local_a8.name.field_2._M_allocated_capacity;
    _Var6._M_p = local_a8.name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.name._M_dataplus._M_p == &local_a8.name.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00229a94;
  case HELICS_DOUBLE:
    local_a8.name._M_dataplus._M_p =
         (pointer)((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                  (double)(val.internalTimeCode / 1000000000));
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&local_a8);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    local_a8.name._M_dataplus._M_p = (pointer)val.internalTimeCode;
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_a8);
    break;
  case HELICS_VECTOR:
    local_78._M_dataplus._M_p =
         (pointer)((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                  (double)(val.internalTimeCode / 1000000000));
    __l._M_len = 1;
    __l._M_array = (iterator)&local_78;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_a8,__l,(allocator_type *)&local_58)
    ;
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_a8);
    goto LAB_002299a4;
  case HELICS_COMPLEX_VECTOR:
    local_a8.name._M_dataplus._M_p = (pointer)0x0;
    local_a8.name._M_string_length = 0;
    local_a8.name.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p =
         (pointer)((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                  (double)(val.internalTimeCode / 1000000000));
    local_58._M_len = 0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_a8,
               (double *)&local_78,(double *)&local_58);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_a8);
LAB_002299a4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.name._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return __return_storage_ptr__;
    }
    uVar5 = local_a8.name.field_2._M_allocated_capacity - (long)local_a8.name._M_dataplus._M_p;
    _Var6._M_p = local_a8.name._M_dataplus._M_p;
    goto LAB_00229a97;
  case HELICS_NAMED_POINT:
    if ((ulong)val.internalTimeCode < 0x10000000000001) {
      local_80 = (double)((int)val.internalTimeCode +
                         (int)((ulong)val.internalTimeCode / 1000000000) * -1000000000) * 1e-09 +
                 (double)((ulong)val.internalTimeCode / 1000000000);
      paVar1 = &local_a8.name.field_2;
      local_a8.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"value","");
      local_a8.value = local_80;
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_a8);
      local_78.field_2._M_allocated_capacity = local_a8.name.field_2._M_allocated_capacity;
      _Var6._M_p = local_a8.name._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.name._M_dataplus._M_p == paVar1) {
        return __return_storage_ptr__;
      }
    }
    else {
      fmt_00.size_ = 3;
      fmt_00.data_ = (char *)0x2;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_58;
      local_58._M_len = val.internalTimeCode;
      ::fmt::v11::vformat_abi_cxx11_(&local_78,(v11 *)0x44c60e,fmt_00,args_00);
      _Var6._M_p = local_78._M_dataplus._M_p;
      pcVar7 = local_78._M_dataplus._M_p + local_78._M_string_length;
      local_80 = nan("0");
      paVar1 = &local_a8.name.field_2;
      local_a8.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,_Var6._M_p,pcVar7);
      local_a8.value = local_80;
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8.name._M_dataplus._M_p,
                        local_a8.name.field_2._M_allocated_capacity + 1);
      }
      _Var6._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return __return_storage_ptr__;
      }
    }
LAB_00229a94:
    uVar5 = local_78.field_2._M_allocated_capacity + 1;
LAB_00229a97:
    operator_delete(_Var6._M_p,uVar5);
    break;
  case HELICS_BOOL:
    local_a8.name._M_string_length = 0x466467;
    if (val.internalTimeCode == 0) {
      local_a8.name._M_string_length = 0x45ed45;
    }
    local_a8.name._M_string_length = local_a8.name._M_string_length + 1;
    local_a8.name._M_dataplus._M_p = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_a8)
    ;
    break;
  default:
    if (type == HELICS_JSON) {
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffffffffff00;
      local_78._M_string_length = 0;
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_TIME);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_30,val_00);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_78,"type");
      vVar2 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_30.m_type;
      jVar3 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_30.m_value;
      local_30.m_type = vVar2;
      local_30.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_30);
      local_48.m_type = null;
      local_48._1_7_ = 0;
      local_48.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,val.internalTimeCode);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_78,"value");
      vVar2 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_48.m_type;
      local_48.m_type = vVar2;
      jVar3 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value.object = (object_t *)local_48.m_value;
      local_48.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      fileops::generateJsonString(&local_a8.name,(json *)&local_78,true);
      _Var6._M_p = local_a8.name._M_dataplus._M_p;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_a8.name._M_string_length);
      __return_storage_ptr__->bufferSize = local_a8.name._M_string_length;
      memcpy(__return_storage_ptr__->heap,_Var6._M_p,local_a8.name._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.name._M_dataplus._M_p != &local_a8.name.field_2) {
        operator_delete(local_a8.name._M_dataplus._M_p,
                        local_a8.name.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_78);
      return __return_storage_ptr__;
    }
  case HELICS_COMPLEX:
    local_a8.name._M_dataplus._M_p =
         (pointer)((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                  (double)(val.internalTimeCode / 1000000000));
    local_a8.name._M_string_length = 0;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_a8);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, Time val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(static_cast<double>(val));
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(val.getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
        default:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(static_cast<double>(val), 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != timeZero) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(
                helicsIntString(val.getBaseTimeCode()));
        case DataType::HELICS_NAMED_POINT:
            if (static_cast<uint64_t>(val.getBaseTimeCode()) >
                (2ULL << 51U))  // this checks whether the actual value will fit in a double
            {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{helicsIntString(val.getBaseTimeCode()), std::nan("0")});
            } else {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{"value", static_cast<double>(val)});
            }
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cval;
            cval.emplace_back(static_cast<double>(val), 0.0);
            return ValueConverter<std::vector<std::complex<double>>>::convert(cval);
        }
        case DataType::HELICS_VECTOR: {
            const std::vector<double> vec{static_cast<double>(val)};
            return ValueConverter<std::vector<double>>::convert(vec);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_TIME);
            json["value"] = val.getBaseTimeCode();
            return fileops::generateJsonString(json);
        }
    }
}